

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_0::OptimizePadding
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *fields,Options *options)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppFVar6;
  LogMessage *other;
  reference pvVar7;
  iterator __first;
  iterator __last;
  long lVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar9;
  const_iterator __first_00;
  const_iterator __last_00;
  pointer *local_468;
  pointer *local_450;
  pointer *local_438;
  float local_404;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
  *local_378;
  pointer *local_360;
  pointer *local_348;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_328;
  const_iterator local_320;
  int local_318;
  int local_314;
  int i_3;
  int f_2;
  __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>_>
  local_308;
  int local_2fc;
  undefined1 local_2f8 [4];
  int j_2;
  FieldGroup field_group_1;
  int i_2;
  int local_2bc;
  undefined1 local_2b8 [4];
  int j_1;
  FieldGroup field_group;
  int local_290;
  int i_1;
  int f_1;
  FieldGroup local_250;
  FieldGroup local_230;
  FieldGroup local_210;
  int local_1f0;
  int j;
  uint local_1dc;
  FieldDescriptor *pFStack_1d8;
  Family f;
  FieldDescriptor *field;
  undefined1 local_1c8 [4];
  int i;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
  aligned_to_8 [6];
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
  aligned_to_4 [6];
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
  aligned_to_1 [6];
  Options *options_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  
  local_348 = &aligned_to_4[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  aligned_to_1[5].
  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)options;
  do {
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
              *)local_348);
    local_348 = local_348 + 3;
  } while (local_348 !=
           &aligned_to_1[5].
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_360 = &aligned_to_8[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
              *)local_360);
    local_360 = local_360 + 3;
  } while (local_360 !=
           &aligned_to_4[5].
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_378 = (vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               *)local_1c8;
  do {
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::vector(local_378);
    local_378 = local_378 + 1;
  } while (local_378 !=
           (vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
            *)&aligned_to_8[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (field._4_4_ = 0; uVar4 = (ulong)field._4_4_,
      sVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(fields), uVar4 < sVar5; field._4_4_ = field._4_4_ + 1) {
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](fields,(long)field._4_4_);
    pFStack_1d8 = *ppFVar6;
    local_1dc = 5;
    bVar1 = FieldDescriptor::is_repeated(pFStack_1d8);
    if (bVar1) {
      local_1dc = 0;
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(pFStack_1d8);
      if (CVar2 == CPPTYPE_STRING) {
        local_1dc = 1;
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(pFStack_1d8);
        if (CVar2 == CPPTYPE_MESSAGE) {
          local_1dc = 2;
        }
        else {
          bVar1 = CanInitializeByZeroing(pFStack_1d8);
          if (bVar1) {
            local_1dc = 4;
          }
        }
      }
    }
    local_1f0 = FieldDescriptor::number(pFStack_1d8);
    iVar3 = EstimateAlignmentSize(pFStack_1d8);
    if (iVar3 == 1) {
      uVar4 = (ulong)local_1dc;
      FieldGroup::FieldGroup(&local_210,(float)local_1f0,pFStack_1d8);
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                   *)&aligned_to_4[uVar4 + 5].
                      super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_210);
      FieldGroup::~FieldGroup(&local_210);
    }
    else if (iVar3 == 4) {
      uVar4 = (ulong)local_1dc;
      FieldGroup::FieldGroup(&local_230,(float)local_1f0,pFStack_1d8);
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                   *)&aligned_to_8[uVar4 + 5].
                      super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_230);
      FieldGroup::~FieldGroup(&local_230);
    }
    else if (iVar3 == 8) {
      uVar4 = (ulong)local_1dc;
      FieldGroup::FieldGroup(&local_250,(float)local_1f0,pFStack_1d8);
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                   *)(local_1c8 + uVar4 * 0x18),&local_250);
      FieldGroup::~FieldGroup(&local_250);
    }
    else {
      internal::LogMessage::LogMessage
                ((LogMessage *)&f_1,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x13a);
      other = internal::LogMessage::operator<<((LogMessage *)&f_1,"Unknown alignment size.");
      internal::LogFinisher::operator=((LogFinisher *)((long)&i_1 + 3),other);
      internal::LogMessage::~LogMessage((LogMessage *)&f_1);
    }
  }
  for (local_290 = 0; local_290 < 6; local_290 = local_290 + 1) {
    for (field_group.fields_.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar4 = (ulong)field_group.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar5 = std::
                vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                        *)&aligned_to_4[(long)local_290 + 5].
                           super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4) {
      FieldGroup::FieldGroup((FieldGroup *)local_2b8);
      for (local_2bc = field_group.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          sVar5 = std::
                  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                  ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                          *)&aligned_to_4[(long)local_290 + 5].
                             super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          (ulong)(long)local_2bc < sVar5 &&
          local_2bc <
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4; local_2bc = local_2bc + 1) {
        pvVar7 = std::
                 vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                 ::operator[]((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                               *)&aligned_to_4[(long)local_290 + 5].
                                  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_2bc
                             );
        FieldGroup::Append((FieldGroup *)local_2b8,pvVar7);
      }
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                   *)&aligned_to_8[(long)local_290 + 5].
                      super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2b8);
      FieldGroup::~FieldGroup((FieldGroup *)local_2b8);
    }
    __first = std::
              vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
              ::begin((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                       *)&aligned_to_8[(long)local_290 + 5].
                          super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __last = std::
             vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
             ::end((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                    *)&aligned_to_8[(long)local_290 + 5].
                       super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>>>>
              ((__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>_>
                )__first._M_current,
               (__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>_>
                )__last._M_current);
    for (field_group_1.fields_.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar4 = (ulong)field_group_1.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar5 = std::
                vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                        *)&aligned_to_8[(long)local_290 + 5].
                           super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
        field_group_1.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             field_group_1.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2) {
      FieldGroup::FieldGroup((FieldGroup *)local_2f8);
      for (local_2fc = field_group_1.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          uVar4 = (ulong)local_2fc,
          sVar5 = std::
                  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                  ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                          *)&aligned_to_8[(long)local_290 + 5].
                             super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          uVar4 < sVar5 &&
          local_2fc <
          field_group_1.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2; local_2fc = local_2fc + 1) {
        pvVar7 = std::
                 vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                 ::operator[]((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                               *)&aligned_to_8[(long)local_290 + 5].
                                  super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_2fc
                             );
        FieldGroup::Append((FieldGroup *)local_2f8,pvVar7);
      }
      lVar8 = (long)field_group_1.fields_.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      sVar5 = std::
              vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
              ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                      *)&aligned_to_8[(long)local_290 + 5].
                         super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (lVar8 == sVar5 - 1) {
        if (local_290 == 5) {
          FieldGroup::SetPreferredLocation((FieldGroup *)local_2f8,-1.0);
        }
        else {
          sVar5 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size(fields);
          local_404 = (float)(sVar5 + 1);
          FieldGroup::SetPreferredLocation((FieldGroup *)local_2f8,local_404);
        }
      }
      std::
      vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                   *)(local_1c8 + (long)local_290 * 0x18),(value_type *)local_2f8);
      FieldGroup::~FieldGroup((FieldGroup *)local_2f8);
    }
    local_308._M_current =
         (FieldGroup *)
         std::
         vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
         ::begin((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                  *)(local_1c8 + (long)local_290 * 0x18));
    _i_3 = std::
           vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
           ::end((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                  *)(local_1c8 + (long)local_290 * 0x18));
    std::
    stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>>>>
              (local_308,
               (__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>_>
                )_i_3);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear(fields);
  for (local_314 = 0; local_314 < 6; local_314 = local_314 + 1) {
    for (local_318 = 0; uVar4 = (ulong)local_318,
        sVar5 = std::
                vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                ::size((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                        *)(local_1c8 + (long)local_314 * 0x18)), uVar4 < sVar5;
        local_318 = local_318 + 1) {
      local_328._M_current =
           (FieldDescriptor **)
           std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::end(fields);
      __gnu_cxx::
      __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
      ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                  *)&local_320,&local_328);
      pvVar7 = std::
               vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ::operator[]((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                             *)(local_1c8 + (long)local_314 * 0x18),(long)local_318);
      pvVar9 = FieldGroup::fields(pvVar7);
      __first_00 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::begin(pvVar9);
      pvVar7 = std::
               vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ::operator[]((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
                             *)(local_1c8 + (long)local_314 * 0x18),(long)local_318);
      pvVar9 = FieldGroup::fields(pvVar7);
      __last_00 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end(pvVar9);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::
      insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)fields,local_320,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )__last_00._M_current);
    }
  }
  local_438 = &aligned_to_8[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_438 = local_438 + -3;
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::~vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               *)local_438);
  } while (local_438 != (pointer *)local_1c8);
  local_450 = &aligned_to_4[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_450 = local_450 + -3;
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::~vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               *)local_450);
  } while (local_450 !=
           &aligned_to_8[5].
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_468 = &aligned_to_1[5].
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_468 = local_468 + -3;
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
    ::~vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
               *)local_468);
  } while (local_468 !=
           &aligned_to_4[5].
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void OptimizePadding(std::vector<const FieldDescriptor*>* fields,
                     const Options& options) {
  // The sorted numeric order of Family determines the declaration order in the
  // memory layout.
  enum Family {
    REPEATED = 0,
    STRING = 1,
    MESSAGE = 2,
    ZERO_INITIALIZABLE = 4,
    OTHER = 5,
    kMaxFamily
  };

  // First divide fields into those that align to 1 byte, 4 bytes or 8 bytes.
  std::vector<FieldGroup> aligned_to_1[kMaxFamily];
  std::vector<FieldGroup> aligned_to_4[kMaxFamily];
  std::vector<FieldGroup> aligned_to_8[kMaxFamily];
  for (int i = 0; i < fields->size(); ++i) {
    const FieldDescriptor* field = (*fields)[i];

    Family f = OTHER;
    if (field->is_repeated()) {
      f = REPEATED;
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      f = STRING;
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      f = MESSAGE;

    } else if (CanInitializeByZeroing(field)) {
      f = ZERO_INITIALIZABLE;
    }

    const int j = field->number();
    switch (EstimateAlignmentSize(field)) {
      case 1: aligned_to_1[f].push_back(FieldGroup(j, field)); break;
      case 4: aligned_to_4[f].push_back(FieldGroup(j, field)); break;
      case 8: aligned_to_8[f].push_back(FieldGroup(j, field)); break;
      default:
        GOOGLE_LOG(FATAL) << "Unknown alignment size.";
    }
  }

  // For each family, group fields to optimize padding.
  for (int f = 0; f < kMaxFamily; f++) {
    // Now group fields aligned to 1 byte into sets of 4, and treat those like a
    // single field aligned to 4 bytes.
    for (int i = 0; i < aligned_to_1[f].size(); i += 4) {
      FieldGroup field_group;
      for (int j = i; j < aligned_to_1[f].size() && j < i + 4; ++j) {
        field_group.Append(aligned_to_1[f][j]);
      }
      aligned_to_4[f].push_back(field_group);
    }
    // Sort by preferred location to keep fields as close to their field number
    // order as possible.  Using stable_sort ensures that the output is
    // consistent across runs.
    std::stable_sort(aligned_to_4[f].begin(), aligned_to_4[f].end());

    // Now group fields aligned to 4 bytes (or the 4-field groups created above)
    // into pairs, and treat those like a single field aligned to 8 bytes.
    for (int i = 0; i < aligned_to_4[f].size(); i += 2) {
      FieldGroup field_group;
      for (int j = i; j < aligned_to_4[f].size() && j < i + 2; ++j) {
        field_group.Append(aligned_to_4[f][j]);
      }
      if (i == aligned_to_4[f].size() - 1) {
        if (f == OTHER) {
          // Move incomplete 4-byte block to the beginning.  This is done to
          // pair with the (possible) leftover blocks from the
          // ZERO_INITIALIZABLE family.
          field_group.SetPreferredLocation(-1);
        } else {
          // Move incomplete 4-byte block to the end.
          field_group.SetPreferredLocation(fields->size() + 1);
        }
      }
      aligned_to_8[f].push_back(field_group);
    }
    // Sort by preferred location.
    std::stable_sort(aligned_to_8[f].begin(), aligned_to_8[f].end());
  }

  // Now pull out all the FieldDescriptors in order.
  fields->clear();
  for (int f = 0; f < kMaxFamily; ++f) {
    for (int i = 0; i < aligned_to_8[f].size(); ++i) {
      fields->insert(fields->end(),
                     aligned_to_8[f][i].fields().begin(),
                     aligned_to_8[f][i].fields().end());
    }
  }
}